

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int Dau_DsdDecomposeInternal(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  int iVar1;
  int nVars_local;
  int *pVars_local;
  word *pTruth_local;
  Dau_Dsd_t *p_local;
  
  iVar1 = Dau_DsdDecomposeSingleVar(p,pTruth,pVars,nVars);
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = Dau_DsdDecomposeDoubleVars(p,pTruth,pVars,iVar1);
    if (iVar1 == 0) {
      p_local._4_4_ = 0;
    }
    else {
      iVar1 = Dau_DsdDecomposeTripleVars(p,pTruth,pVars,iVar1);
      if (iVar1 == 0) {
        p_local._4_4_ = 0;
      }
      else {
        p_local._4_4_ = Dau_DsdWritePrime(p,pTruth,pVars,iVar1);
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Dau_DsdDecomposeInternal( Dau_Dsd_t * p, word  * pTruth, int * pVars, int nVars )
{
    // decompose single variales on the output side
    nVars = Dau_DsdDecomposeSingleVar( p, pTruth, pVars, nVars );
    if ( nVars == 0 )
        return 0;
    // decompose double variables on the input side
    nVars = Dau_DsdDecomposeDoubleVars( p, pTruth, pVars, nVars );
    if ( nVars == 0 )
        return 0;
    // decompose MUX on the output/input side
    nVars = Dau_DsdDecomposeTripleVars( p, pTruth, pVars, nVars );
    if ( nVars == 0 )
        return 0;
    // write non-decomposable function
    return Dau_DsdWritePrime( p, pTruth, pVars, nVars );
}